

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

void Saig_BmcManStop(Saig_Bmc_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *__ptr;
  Vec_Int_t *pVVar2;
  int *piVar3;
  void **__ptr_00;
  int iVar4;
  long lVar5;
  
  Aig_ManStop(p->pFrm);
  pVVar1 = p->vAig2Frm;
  iVar4 = pVVar1->nSize;
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      __ptr = pVVar1->pArray[lVar5];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
        iVar4 = pVVar1->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  pVVar2 = p->vObj2Var;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (solver_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  pVVar1 = p->vTargets;
  __ptr_00 = pVVar1->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(pVVar1);
  pVVar2 = p->vVisited;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  free(p);
  return;
}

Assistant:

void Saig_BmcManStop( Saig_Bmc_t * p )
{
    Aig_ManStop( p->pFrm  );
    Vec_VecFree( (Vec_Vec_t *)p->vAig2Frm );
    Vec_IntFree( p->vObj2Var );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    Vec_PtrFree( p->vTargets );
    Vec_IntFree( p->vVisited );
    ABC_FREE( p );
}